

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acto.h
# Opt level: O0

void __thiscall acto::core::msg_wrap_t<A::MR>::~msg_wrap_t(msg_wrap_t<A::MR> *this)

{
  msg_wrap_t<A::MR> *this_local;
  
  message_container<A::MR,_false>::~message_container(&this->super_message_container_t<A::MR>);
  msg_t::~msg_t(&this->super_msg_t);
  return;
}

Assistant:

constexpr msg_wrap_t(T&& d) noexcept(
    std::is_nothrow_constructible_v<message_container_t<T>, T&&>)
    : msg_t(typeid(T))
    , message_container_t<T>(std::move(d)) {
  }